

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table_function-c.cpp
# Opt level: O2

unique_ptr<duckdb::GlobalTableFunctionState,_std::default_delete<duckdb::GlobalTableFunctionState>,_true>
 __thiscall
duckdb::CTableFunctionInit(duckdb *this,ClientContext *context,TableFunctionInitInput *data_p)

{
  _Head_base<0UL,_duckdb::CTableGlobalInitData_*,_false> _Var1;
  CTableBindData *pCVar2;
  pointer pCVar3;
  InvalidInputException *this_00;
  _Head_base<0UL,_duckdb::CTableGlobalInitData_*,_false> local_70;
  CTableInternalInitInfo init_info;
  
  pCVar2 = (CTableBindData *)
           optional_ptr<const_duckdb::FunctionData,_true>::operator->(&data_p->bind_data);
  make_uniq<duckdb::CTableGlobalInitData>();
  pCVar3 = unique_ptr<duckdb::CTableGlobalInitData,_std::default_delete<duckdb::CTableGlobalInitData>,_true>
           ::operator->((unique_ptr<duckdb::CTableGlobalInitData,_std::default_delete<duckdb::CTableGlobalInitData>,_true>
                         *)&local_70);
  init_info.init_data = &pCVar3->init_data;
  init_info.filters.ptr = (data_p->filters).ptr;
  init_info.column_ids = &data_p->column_ids;
  init_info.success = true;
  init_info.error._M_dataplus._M_p = (pointer)&init_info.error.field_2;
  init_info.error._M_string_length = 0;
  init_info.error.field_2._M_local_buf[0] = '\0';
  init_info.bind_data = pCVar2;
  (*pCVar2->info->init)(&init_info);
  _Var1._M_head_impl = local_70._M_head_impl;
  if (init_info.success != false) {
    local_70._M_head_impl = (CTableGlobalInitData *)0x0;
    *(CTableGlobalInitData **)this = _Var1._M_head_impl;
    ::std::__cxx11::string::~string((string *)&init_info.error);
    if (local_70._M_head_impl != (CTableGlobalInitData *)0x0) {
      (*((local_70._M_head_impl)->super_GlobalTableFunctionState)._vptr_GlobalTableFunctionState[1])
                ();
    }
    return (unique_ptr<duckdb::GlobalTableFunctionState,_std::default_delete<duckdb::GlobalTableFunctionState>_>
            )(unique_ptr<duckdb::GlobalTableFunctionState,_std::default_delete<duckdb::GlobalTableFunctionState>_>
              )this;
  }
  this_00 = (InvalidInputException *)__cxa_allocate_exception(0x10);
  InvalidInputException::InvalidInputException(this_00,&init_info.error);
  __cxa_throw(this_00,&InvalidInputException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

unique_ptr<GlobalTableFunctionState> CTableFunctionInit(ClientContext &context, TableFunctionInitInput &data_p) {
	auto &bind_data = data_p.bind_data->Cast<CTableBindData>();
	auto result = make_uniq<CTableGlobalInitData>();

	CTableInternalInitInfo init_info(bind_data, result->init_data, data_p.column_ids, data_p.filters);
	bind_data.info.init(ToCInitInfo(init_info));
	if (!init_info.success) {
		throw InvalidInputException(init_info.error);
	}
	return std::move(result);
}